

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderContext.cpp
# Opt level: O3

bool glu::contextSupports(ContextType ctxType,ApiType requiredApiType)

{
  bool bVar1;
  
  switch((uint)ctxType.super_ApiType.m_bits >> 8 & 3) {
  case 0:
    if ((requiredApiType.m_bits & 0x300) != 0) {
      return false;
    }
    break;
  case 1:
    if (((uint)ctxType.super_ApiType.m_bits >> 0xc & 1) != 0) {
      return ((uint)ctxType.super_ApiType.m_bits & 0x3ff) == requiredApiType.m_bits;
    }
    if ((requiredApiType.m_bits & 0x300) != 0x100) {
      return false;
    }
    break;
  case 2:
    if (1 < (requiredApiType.m_bits >> 8 & 3) - 1) {
      return false;
    }
    break;
  case 3:
    goto switchD_018bad2e_caseD_3;
  }
  bVar1 = true;
  if (((uint)ctxType.super_ApiType.m_bits & 0xf) <= (requiredApiType.m_bits & 0xf)) {
    if (((uint)ctxType.super_ApiType.m_bits & 0xf) != (requiredApiType.m_bits & 0xf)) {
switchD_018bad2e_caseD_3:
      return false;
    }
    bVar1 = (requiredApiType.m_bits >> 4 & 0xf) <= ((uint)ctxType.super_ApiType.m_bits >> 4 & 0xf);
  }
  return bVar1;
}

Assistant:

bool contextSupports (ContextType ctxType, ApiType requiredApiType)
{
	// \todo [2014-10-06 pyry] Check exact forward-compatible restrictions.
	const bool forwardCompatible = (ctxType.getFlags() & CONTEXT_FORWARD_COMPATIBLE) != 0;

	if (isContextTypeES(ctxType))
	{
		DE_ASSERT(!forwardCompatible);
		return requiredApiType.getProfile() == PROFILE_ES &&
			   versionGreaterOrEqual(ctxType.getAPI(), requiredApiType);
	}
	else if (isContextTypeGLCore(ctxType))
	{
		if (forwardCompatible)
			return ctxType.getAPI() == requiredApiType;
		else
			return requiredApiType.getProfile() == PROFILE_CORE &&
				   versionGreaterOrEqual(ctxType.getAPI(), requiredApiType);
	}
	else if (isContextTypeGLCompatibility(ctxType))
	{
		DE_ASSERT(!forwardCompatible);
		return (requiredApiType.getProfile() == PROFILE_CORE || requiredApiType.getProfile() == PROFILE_COMPATIBILITY) &&
			   versionGreaterOrEqual(ctxType.getAPI(), requiredApiType);
	}
	else
	{
		DE_ASSERT(false);
		return false;
	}
}